

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_tpl.h
# Opt level: O1

uint32_t longest_match_slow_sse2(deflate_state *s,Pos cur_match)

{
  uchar *puVar1;
  uint uVar2;
  uchar *puVar3;
  Pos *pPVar4;
  long lVar5;
  uint uVar6;
  uint32_t uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  uchar *puVar19;
  ushort uVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  uchar *puVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  ulong local_e8;
  uint local_e0;
  uchar *local_c8;
  uint local_bc;
  uchar *local_b8;
  ulong local_70;
  int local_58;
  
  uVar13 = (ulong)cur_match;
  uVar9 = s->strstart;
  uVar16 = (ulong)uVar9;
  uVar2 = s->w_mask;
  puVar3 = s->window;
  uVar21 = 2;
  if (s->prev_length != 0) {
    uVar21 = s->prev_length;
  }
  uVar10 = 0xffffffff;
  if (3 < uVar21) {
    uVar10 = (uint)(uVar21 < 8) << 2 | 0xfffffff9;
  }
  local_e8 = *(ulong *)(puVar3 + (uVar10 + uVar21) + uVar16);
  local_b8 = puVar3 + (uVar10 + uVar21);
  uVar10 = s->lookahead;
  uVar23 = s->max_chain_length >> 2;
  if (uVar21 < s->good_match) {
    uVar23 = s->max_chain_length;
  }
  uVar6 = s->w_size - 0x106;
  uVar22 = 0;
  uVar24 = uVar9 - uVar6;
  if (uVar9 < uVar6 || uVar24 == 0) {
    uVar24 = 0;
  }
  pPVar4 = s->prev;
  lVar5 = *(long *)(puVar3 + uVar16);
  uVar6 = s->nice_match;
  uVar26 = uVar24;
  local_c8 = puVar3;
  if (2 < uVar21) {
    uVar22 = 0;
    uVar7 = (*s->update_hash)(0,(uint32_t)puVar3[uVar16 + 1]);
    uVar7 = (*s->update_hash)(uVar7,(uint32_t)puVar3[uVar16 + 2]);
    uVar27 = 3;
    do {
      uVar7 = (*s->update_hash)(uVar7,(uint32_t)puVar3[uVar27 + uVar16]);
      if (s->head[uVar7] < (ushort)uVar13) {
        uVar22 = (ulong)((int)uVar27 - 2);
        uVar13 = (ulong)s->head[uVar7];
      }
      uVar26 = (int)uVar27 + 1;
      uVar27 = (ulong)uVar26;
    } while (uVar26 <= uVar21);
    uVar26 = (int)uVar22 + uVar24;
    if ((ushort)uVar13 <= (ushort)uVar26) goto LAB_0010f306;
    local_b8 = local_b8 + -(uVar22 & 0xffff);
    local_c8 = puVar3 + -(uVar22 & 0xffff);
  }
  local_bc = (uint)(local_e8 >> 0x10) & 0xffff;
  local_70 = local_e8 >> 0x20;
  puVar28 = puVar3 + uVar16 + 2;
  uVar15 = (uint)puVar28 & 0xf;
  uVar11 = 0x10 - uVar15;
  uVar27 = (ulong)uVar11;
  local_58 = 0x10 - uVar15;
  do {
    if (uVar9 <= ((uint)uVar13 & 0xffff)) {
      return uVar21;
    }
    uVar20 = (ushort)uVar26;
    if (uVar21 < 4) {
      while ((uVar25 = uVar13 & 0xffff, *(short *)(local_b8 + uVar25) != (short)local_e8 ||
             (*(short *)(local_c8 + uVar25) != (short)lVar5))) {
        if (uVar23 == 1) {
          return uVar21;
        }
        uVar13 = (ulong)pPVar4[(uint)uVar25 & uVar2];
        uVar23 = uVar23 - 1;
        if (pPVar4[(uint)uVar25 & uVar2] <= uVar20) {
          return uVar21;
        }
      }
    }
    else if (uVar21 < 8) {
      while ((uVar25 = uVar13 & 0xffff,
             *(uint *)(local_b8 + uVar25) != (local_bc << 0x10 | (uint)(local_e8 & 0xffff)) ||
             (*(int *)(local_c8 + uVar25) != (int)lVar5))) {
        if (uVar23 == 1) {
          return uVar21;
        }
        uVar13 = (ulong)pPVar4[(uint)uVar25 & uVar2];
        uVar23 = uVar23 - 1;
        if (pPVar4[(uint)uVar25 & uVar2] <= uVar20) {
          return uVar21;
        }
      }
    }
    else {
      while ((uVar25 = uVar13 & 0xffff,
             *(ulong *)(local_b8 + uVar25) !=
             (local_70 << 0x20 | local_e8 & 0xffff | (ulong)(local_bc << 0x10)) ||
             (*(long *)(local_c8 + uVar25) != lVar5))) {
        if (uVar23 == 1) {
          return uVar21;
        }
        uVar13 = (ulong)pPVar4[(uint)uVar25 & uVar2];
        uVar23 = uVar23 - 1;
        if (pPVar4[(uint)uVar25 & uVar2] <= uVar20) {
          return uVar21;
        }
      }
    }
    uVar25 = uVar13 & 0xffff;
    puVar19 = local_c8 + uVar25 + 2;
    auVar32[0] = -(*puVar19 == *puVar28);
    auVar32[1] = -(puVar19[1] == puVar3[uVar16 + 3]);
    auVar32[2] = -(puVar19[2] == puVar3[uVar16 + 4]);
    auVar32[3] = -(puVar19[3] == puVar3[uVar16 + 5]);
    auVar32[4] = -(puVar19[4] == puVar3[uVar16 + 6]);
    auVar32[5] = -(puVar19[5] == puVar3[uVar16 + 7]);
    auVar32[6] = -(puVar19[6] == puVar3[uVar16 + 8]);
    auVar32[7] = -(puVar19[7] == puVar3[uVar16 + 9]);
    auVar32[8] = -(puVar19[8] == puVar3[uVar16 + 10]);
    auVar32[9] = -(puVar19[9] == puVar3[uVar16 + 0xb]);
    auVar32[10] = -(puVar19[10] == puVar3[uVar16 + 0xc]);
    auVar32[0xb] = -(puVar19[0xb] == puVar3[uVar16 + 0xd]);
    auVar32[0xc] = -(puVar19[0xc] == puVar3[uVar16 + 0xe]);
    auVar32[0xd] = -(puVar19[0xd] == puVar3[uVar16 + 0xf]);
    auVar32[0xe] = -(puVar19[0xe] == puVar3[uVar16 + 0x10]);
    auVar32[0xf] = -(puVar19[0xf] == puVar3[uVar16 + 0x11]);
    uVar20 = (ushort)(SUB161(auVar32 >> 7,0) & 1) | (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe | (ushort)(auVar32[0xf] >> 7) << 0xf;
    if (uVar20 == 0xffff) {
      puVar19 = local_c8 + uVar27 + uVar25 + 2;
      puVar1 = puVar28 + uVar27;
      auVar30[0] = -(*puVar19 == *puVar1);
      auVar30[1] = -(puVar19[1] == puVar1[1]);
      auVar30[2] = -(puVar19[2] == puVar1[2]);
      auVar30[3] = -(puVar19[3] == puVar1[3]);
      auVar30[4] = -(puVar19[4] == puVar1[4]);
      auVar30[5] = -(puVar19[5] == puVar1[5]);
      auVar30[6] = -(puVar19[6] == puVar1[6]);
      auVar30[7] = -(puVar19[7] == puVar1[7]);
      auVar30[8] = -(puVar19[8] == puVar1[8]);
      auVar30[9] = -(puVar19[9] == puVar1[9]);
      auVar30[10] = -(puVar19[10] == puVar1[10]);
      auVar30[0xb] = -(puVar19[0xb] == puVar1[0xb]);
      auVar30[0xc] = -(puVar19[0xc] == puVar1[0xc]);
      auVar30[0xd] = -(puVar19[0xd] == puVar1[0xd]);
      auVar30[0xe] = -(puVar19[0xe] == puVar1[0xe]);
      auVar30[0xf] = -(puVar19[0xf] == puVar1[0xf]);
      uVar20 = (ushort)(SUB161(auVar30 >> 7,0) & 1) | (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe | (ushort)(auVar30[0xf] >> 7) << 0xf;
      uVar17 = 0;
      bVar29 = false;
      uVar15 = uVar11;
      if (uVar20 == 0xffff) {
        lVar12 = 0;
        do {
          if ((int)lVar12 == 0xe0) {
            bVar29 = 0xd < -uVar17;
            puVar19 = puVar28;
            goto LAB_0010f0b0;
          }
          puVar19 = local_c8 + lVar12 + uVar25 + uVar27 + 0x12;
          puVar1 = puVar3 + lVar12 + uVar16 + uVar27 + 0x12;
          auVar31[0] = -(*puVar19 == *puVar1);
          auVar31[1] = -(puVar19[1] == puVar1[1]);
          auVar31[2] = -(puVar19[2] == puVar1[2]);
          auVar31[3] = -(puVar19[3] == puVar1[3]);
          auVar31[4] = -(puVar19[4] == puVar1[4]);
          auVar31[5] = -(puVar19[5] == puVar1[5]);
          auVar31[6] = -(puVar19[6] == puVar1[6]);
          auVar31[7] = -(puVar19[7] == puVar1[7]);
          auVar31[8] = -(puVar19[8] == puVar1[8]);
          auVar31[9] = -(puVar19[9] == puVar1[9]);
          auVar31[10] = -(puVar19[10] == puVar1[10]);
          auVar31[0xb] = -(puVar19[0xb] == puVar1[0xb]);
          auVar31[0xc] = -(puVar19[0xc] == puVar1[0xc]);
          auVar31[0xd] = -(puVar19[0xd] == puVar1[0xd]);
          auVar31[0xe] = -(puVar19[0xe] == puVar1[0xe]);
          auVar31[0xf] = -(puVar19[0xf] == puVar1[0xf]);
          uVar20 = (ushort)(SUB161(auVar31 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar31[0xf] >> 7) << 0xf;
          lVar12 = lVar12 + 0x10;
          uVar17 = uVar17 - 1;
        } while (uVar20 == 0xffff);
        bVar29 = uVar17 < 0xfffffff2;
        uVar15 = (int)lVar12 + local_58;
      }
      iVar18 = 0;
      if (~(uint)uVar20 != 0) {
        for (; (~(uint)uVar20 >> iVar18 & 1) == 0; iVar18 = iVar18 + 1) {
        }
      }
      puVar19 = (uchar *)(ulong)(iVar18 + uVar15);
LAB_0010f0b0:
      iVar18 = (int)puVar19;
      if ((bVar29) && (iVar18 = 0x100, ((ulong)puVar28 & 0xf) != 0)) {
        auVar33[0] = -(local_c8[uVar25 + 0xf2] == puVar3[uVar16 + 0xf2]);
        auVar33[1] = -(local_c8[uVar25 + 0xf3] == puVar3[uVar16 + 0xf3]);
        auVar33[2] = -(local_c8[uVar25 + 0xf4] == puVar3[uVar16 + 0xf4]);
        auVar33[3] = -(local_c8[uVar25 + 0xf5] == puVar3[uVar16 + 0xf5]);
        auVar33[4] = -(local_c8[uVar25 + 0xf6] == puVar3[uVar16 + 0xf6]);
        auVar33[5] = -(local_c8[uVar25 + 0xf7] == puVar3[uVar16 + 0xf7]);
        auVar33[6] = -(local_c8[uVar25 + 0xf8] == puVar3[uVar16 + 0xf8]);
        auVar33[7] = -(local_c8[uVar25 + 0xf9] == puVar3[uVar16 + 0xf9]);
        auVar33[8] = -(local_c8[uVar25 + 0xfa] == puVar3[uVar16 + 0xfa]);
        auVar33[9] = -(local_c8[uVar25 + 0xfb] == puVar3[uVar16 + 0xfb]);
        auVar33[10] = -(local_c8[uVar25 + 0xfc] == puVar3[uVar16 + 0xfc]);
        auVar33[0xb] = -(local_c8[uVar25 + 0xfd] == puVar3[uVar16 + 0xfd]);
        auVar33[0xc] = -(local_c8[uVar25 + 0xfe] == puVar3[uVar16 + 0xfe]);
        auVar33[0xd] = -(local_c8[uVar25 + 0xff] == puVar3[uVar16 + 0xff]);
        auVar33[0xe] = -(local_c8[uVar25 + 0x100] == puVar3[uVar16 + 0x100]);
        auVar33[0xf] = -(local_c8[uVar25 + 0x101] == puVar3[uVar16 + 0x101]);
        uVar20 = (ushort)(SUB161(auVar33 >> 7,0) & 1) | (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe | (ushort)(auVar33[0xf] >> 7) << 0xf
        ;
        if (uVar20 == 0xffff) {
          iVar18 = 0x100;
        }
        else {
          uVar15 = ~(uint)uVar20;
          iVar18 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> iVar18 & 1) == 0; iVar18 = iVar18 + 1) {
            }
          }
          iVar18 = iVar18 + 0xf0;
        }
      }
    }
    else {
      uVar15 = ~(uint)uVar20;
      iVar18 = 0;
      if (uVar15 != 0) {
        for (; (uVar15 >> iVar18 & 1) == 0; iVar18 = iVar18 + 1) {
        }
      }
    }
    uVar15 = iVar18 + 2;
    if (uVar21 < uVar15) {
      uVar17 = (int)uVar25 - ((uint)uVar22 & 0xffff);
      s->match_start = uVar17;
      iVar8 = 1;
      if (uVar10 < uVar15) {
        bVar29 = false;
        local_e0 = uVar10;
      }
      else {
        uVar21 = uVar15;
        if (uVar15 < uVar6) {
          uVar14 = iVar18 - 5;
          if (uVar15 < 8) {
            uVar14 = iVar18 - 1U;
          }
          if (uVar15 < 4) {
            uVar14 = iVar18 + 1;
          }
          uVar25 = (ulong)uVar14;
          local_e8 = *(ulong *)(puVar3 + uVar25 + uVar16);
          local_bc = (uint)(local_e8 >> 0x10) & 0xffff;
          local_70 = local_e8 >> 0x20;
          if ((uVar15 < 4) || (uVar9 <= uVar17 + uVar15)) {
            local_b8 = local_c8 + uVar25;
            iVar8 = 0;
            bVar29 = true;
          }
          else {
            uVar14 = 0;
            uVar22 = 0;
            uVar13 = (ulong)uVar17;
            do {
              uVar20 = pPVar4[(uVar17 & 0xffff) + uVar14 & uVar2];
              if (uVar20 < (ushort)uVar13) {
                uVar13 = (ulong)uVar17;
                if ((uint)uVar20 <= (uVar24 & 0xffff) + uVar14) goto LAB_0010f2e0;
                uVar22 = (ulong)uVar14;
                uVar13 = (ulong)uVar20;
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 <= iVar18 - 1U);
            uVar7 = (*s->update_hash)(0,(uint32_t)puVar3[(ulong)uVar15 + (uVar16 - 4)]);
            uVar7 = (*s->update_hash)(uVar7,(uint32_t)puVar3[(ulong)uVar15 + (uVar16 - 3)]);
            uVar7 = (*s->update_hash)(uVar7,(uint32_t)puVar3[(ulong)uVar15 + (uVar16 - 2)]);
            uVar20 = s->head[uVar7];
            if (uVar20 < (ushort)uVar13) {
              uVar22 = (ulong)(iVar18 - 2U);
              if ((iVar18 - 2U & 0xffff) + (uVar24 & 0xffff) < (uint)uVar20) {
                uVar13 = (ulong)uVar20;
                goto LAB_0010f275;
              }
LAB_0010f2e0:
              iVar8 = 5;
            }
            else {
LAB_0010f275:
              uVar26 = (int)uVar22 + uVar24;
              local_c8 = puVar3 + -(uVar22 & 0xffff);
              local_b8 = local_c8 + uVar25;
              iVar8 = 7;
            }
            bVar29 = false;
          }
        }
        else {
          bVar29 = false;
          local_e0 = uVar15;
        }
      }
      if (bVar29) goto LAB_0010f131;
    }
    else {
LAB_0010f131:
      uVar23 = uVar23 - 1;
      if (uVar23 == 0) {
        iVar8 = 1;
        local_e0 = uVar21;
      }
      else {
        uVar15 = (uint)uVar13;
        uVar13 = (ulong)pPVar4[uVar15 & 0xffff & uVar2];
        iVar8 = 7;
        if (pPVar4[uVar15 & 0xffff & uVar2] <= (ushort)uVar26) {
          iVar8 = 1;
          local_e0 = uVar21;
        }
      }
    }
  } while (iVar8 == 7);
  if (iVar8 != 5) {
    return local_e0;
  }
LAB_0010f306:
  uVar9 = s->lookahead;
  if (uVar21 < s->lookahead) {
    uVar9 = uVar21;
  }
  return uVar9;
}

Assistant:

Z_INTERNAL uint32_t LONGEST_MATCH(deflate_state *const s, Pos cur_match) {
    unsigned int strstart = s->strstart;
    const unsigned wmask = s->w_mask;
    unsigned char *window = s->window;
    unsigned char *scan = window + strstart;
    Z_REGISTER unsigned char *mbase_start = window;
    Z_REGISTER unsigned char *mbase_end;
    const Pos *prev = s->prev;
    Pos limit;
#ifdef LONGEST_MATCH_SLOW
    Pos limit_base;
#else
    int32_t early_exit;
#endif
    uint32_t chain_length, nice_match, best_len, offset;
    uint32_t lookahead = s->lookahead;
    Pos match_offset = 0;
    uint64_t scan_start;
    uint64_t scan_end;

#define GOTO_NEXT_CHAIN \
    if (--chain_length && (cur_match = prev[cur_match & wmask]) > limit) \
        continue; \
    return best_len;

    /* The code is optimized for STD_MAX_MATCH-2 multiple of 16. */
    Assert(STD_MAX_MATCH == 258, "Code too clever");

    best_len = s->prev_length ? s->prev_length : STD_MIN_MATCH-1;

    /* Calculate read offset which should only extend an extra byte
     * to find the next best match length.
     */
    offset = best_len-1;
    if (best_len >= sizeof(uint32_t)) {
        offset -= 2;
        if (best_len >= sizeof(uint64_t))
            offset -= 4;
    }

    scan_start = zng_memread_8(scan);
    scan_end = zng_memread_8(scan+offset);
    mbase_end  = (mbase_start+offset);

    /* Do not waste too much time if we already have a good match */
    chain_length = s->max_chain_length;
    if (best_len >= s->good_match)
        chain_length >>= 2;
    nice_match = (uint32_t)s->nice_match;

    /* Stop when cur_match becomes <= limit. To simplify the code,
     * we prevent matches with the string of window index 0
     */
    limit = strstart > MAX_DIST(s) ? (Pos)(strstart - MAX_DIST(s)) : 0;
#ifdef LONGEST_MATCH_SLOW
    limit_base = limit;
    if (best_len >= STD_MIN_MATCH) {
        /* We're continuing search (lazy evaluation). */
        uint32_t i, hash;
        Pos pos;

        /* Find a most distant chain starting from scan with index=1 (index=0 corresponds
         * to cur_match). We cannot use s->prev[strstart+1,...] immediately, because
         * these strings are not yet inserted into the hash table.
         */
        hash = s->update_hash(0, scan[1]);
        hash = s->update_hash(hash, scan[2]);

        for (i = 3; i <= best_len; i++) {
            hash = s->update_hash(hash, scan[i]);

            /* If we're starting with best_len >= 3, we can use offset search. */
            pos = s->head[hash];
            if (pos < cur_match) {
                match_offset = (Pos)(i - 2);
                cur_match = pos;
            }
        }

        /* Update offset-dependent variables */
        limit = limit_base+match_offset;
        if (cur_match <= limit)
            goto break_matching;
        mbase_start -= match_offset;
        mbase_end -= match_offset;
    }
#else
    early_exit = s->level < EARLY_EXIT_TRIGGER_LEVEL;
#endif
    Assert((unsigned long)strstart <= s->window_size - MIN_LOOKAHEAD, "need lookahead");
    for (;;) {
        if (cur_match >= strstart)
            break;

        /* Skip to next match if the match length cannot increase or if the match length is
         * less than 2. Note that the checks below for insufficient lookahead only occur
         * occasionally for performance reasons.
         * Therefore uninitialized memory will be accessed and conditional jumps will be made
         * that depend on those values. However the length of the match is limited to the
         * lookahead, so the output of deflate is not affected by the uninitialized values.
         */
        if (best_len < sizeof(uint32_t)) {
            for (;;) {
                if (zng_memcmp_2(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_2(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        } else if (best_len >= sizeof(uint64_t)) {
            for (;;) {
                if (zng_memcmp_8(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_8(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        } else {
            for (;;) {
                if (zng_memcmp_4(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_4(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        }
        uint32_t len = COMPARE256(scan+2, mbase_start+cur_match+2) + 2;
        Assert(scan+len <= window+(unsigned)(s->window_size-1), "wild scan");

        if (len > best_len) {
            uint32_t match_start = cur_match - match_offset;
            s->match_start = match_start;

            /* Do not look for matches beyond the end of the input. */
            if (len > lookahead)
                return lookahead;
            best_len = len;
            if (best_len >= nice_match)
                return best_len;

            offset = best_len-1;
            if (best_len >= sizeof(uint32_t)) {
                offset -= 2;
                if (best_len >= sizeof(uint64_t))
                    offset -= 4;
            }

            scan_end = zng_memread_8(scan+offset);

#ifdef LONGEST_MATCH_SLOW
            /* Look for a better string offset */
            if (UNLIKELY(len > STD_MIN_MATCH && match_start + len < strstart)) {
                Pos pos, next_pos;
                uint32_t i, hash;
                unsigned char *scan_endstr;

                /* Go back to offset 0 */
                cur_match -= match_offset;
                match_offset = 0;
                next_pos = cur_match;
                for (i = 0; i <= len - STD_MIN_MATCH; i++) {
                    pos = prev[(cur_match + i) & wmask];
                    if (pos < next_pos) {
                        /* Hash chain is more distant, use it */
                        if (pos <= limit_base + i)
                            goto break_matching;
                        next_pos = pos;
                        match_offset = (Pos)i;
                    }
                }
                /* Switch cur_match to next_pos chain */
                cur_match = next_pos;

                /* Try hash head at len-(STD_MIN_MATCH-1) position to see if we could get
                 * a better cur_match at the end of string. Using (STD_MIN_MATCH-1) lets
                 * us include one more byte into hash - the byte which will be checked
                 * in main loop now, and which allows to grow match by 1.
                 */
                scan_endstr = scan + len - (STD_MIN_MATCH+1);

                hash = s->update_hash(0, scan_endstr[0]);
                hash = s->update_hash(hash, scan_endstr[1]);
                hash = s->update_hash(hash, scan_endstr[2]);

                pos = s->head[hash];
                if (pos < cur_match) {
                    match_offset = (Pos)(len - (STD_MIN_MATCH+1));
                    if (pos <= limit_base + match_offset)
                        goto break_matching;
                    cur_match = pos;
                }

                /* Update offset-dependent variables */
                limit = limit_base+match_offset;
                mbase_start = window-match_offset;
                mbase_end = (mbase_start+offset);
                continue;
            }
#endif
            mbase_end = (mbase_start+offset);
        }
#ifndef LONGEST_MATCH_SLOW
        else if (UNLIKELY(early_exit)) {
            /* The probability of finding a match later if we here is pretty low, so for
             * performance it's best to outright stop here for the lower compression levels
             */
            break;
        }
#endif
        GOTO_NEXT_CHAIN;
    }
    return best_len;

#ifdef LONGEST_MATCH_SLOW
break_matching:

    if (best_len < s->lookahead)
        return best_len;

    return s->lookahead;
#endif
}